

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O2

void poptSetExecPath(poptContext con,char *path,int allowAbsolute)

{
  size_t sVar1;
  char *__dest;
  
  free(con->execPath);
  con->execPath = (char *)0x0;
  sVar1 = strlen(path);
  __dest = (char *)malloc(sVar1 + 1);
  if (__dest != (char *)0x0) {
    strcpy(__dest,path);
    con->execPath = __dest;
    con->execAbsolute = allowAbsolute;
    return;
  }
  fwrite("virtual memory exhausted.\n",0x1a,1,_stderr);
  exit(1);
}

Assistant:

void poptSetExecPath(poptContext con, const char * path, int allowAbsolute)
{
    con->execPath = _free(con->execPath);
    con->execPath = xstrdup(path);
    con->execAbsolute = allowAbsolute;
    return;
}